

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O3

ze_result_t zesGetStandbyProcAddrTable(ze_api_version_t version,zes_standby_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (zes_standby_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnGetProperties = driver::zesStandbyGetProperties;
      pDdiTable->pfnGetMode = driver::zesStandbyGetMode;
      pDdiTable->pfnSetMode = driver::zesStandbySetMode;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetStandbyProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_standby_dditable_t* pDdiTable               ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGetProperties                          = driver::zesStandbyGetProperties;

    pDdiTable->pfnGetMode                                = driver::zesStandbyGetMode;

    pDdiTable->pfnSetMode                                = driver::zesStandbySetMode;

    return result;
}